

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

bool can_see(CHAR_DATA *ch,CHAR_DATA *victim)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  AREA_AFFECT_DATA *pAVar4;
  AFFECT_DATA *pAVar5;
  
  bVar2 = is_npc(ch);
  if (bVar2) {
    if (ch == victim) {
      return true;
    }
    if ((ch->act[0] & 0x20000000U) != 0) {
      return true;
    }
LAB_002fa3d8:
    bVar2 = is_immortal(ch);
    if ((bVar2) || (bVar2 = is_affected_by(victim,0x1e), !bVar2)) {
      bVar2 = is_cabal_guard(ch);
      if ((bVar2) && (ch->desc == (DESCRIPTOR_DATA *)0x0)) goto LAB_002fa4fc;
      iVar3 = get_trust(ch);
      if ((victim->invis_level <= iVar3) &&
         (((iVar3 = get_trust(ch), victim->incog_level <= iVar3 || (ch->in_room == victim->in_room))
          && ((iVar3 = get_trust(ch), iVar3 != 0x33 ||
              ((victim->invis_level != 0x33 || (bVar2 = is_heroimm(ch), bVar2)))))))) {
        bVar2 = is_npc(ch);
        if ((!bVar2) && ((ch->act[0] & 0x2000) != 0)) {
          return true;
        }
        bVar2 = is_npc(ch);
        if ((bVar2) && (bVar2 = is_immortal(ch), bVar2)) {
          return true;
        }
        bVar2 = is_npc(ch);
        if ((!bVar2) || (victim->invis_level < 0x33)) {
          bVar2 = is_npc(ch);
          if ((!bVar2) && (ch->pcdata->death_status == 8)) {
            return true;
          }
          bVar2 = is_cabal_guard(ch);
          if (bVar2) goto LAB_002fa4fc;
          bVar2 = is_affected_by(ch,0);
          if (bVar2) {
            return false;
          }
          bVar2 = is_affected(victim,(int)gsn_ultradiffusion);
          if (!bVar2) {
            bVar2 = is_affected_area(ch->in_room->area,(int)gsn_whiteout);
            if ((bVar2) && (bVar2 = is_outside(ch), bVar2)) {
              pAVar4 = (AREA_AFFECT_DATA *)&ch->in_room->area->affected;
              do {
                pAVar4 = pAVar4->next;
                if (pAVar4 == (AREA_AFFECT_DATA *)0x0) break;
              } while (pAVar4->type != gsn_whiteout);
              if (pAVar4->owner != ch) goto LAB_002fa5c7;
            }
            bVar2 = is_affected(victim,(int)gsn_watermeld);
            if (((!bVar2) || (bVar2 = is_affected(ch,(int)gsn_hydroperception), bVar2)) &&
               (bVar2 = is_affected(victim,(int)gsn_earthfade), !bVar2)) {
              bVar2 = is_affected_by(victim,1);
              if ((bVar2) && (bVar2 = is_affected_by(ch,3), !bVar2)) {
                bVar2 = is_affected(ch,(int)gsn_hydroperception);
                if (bVar2) {
                  sVar1 = ch->in_room->sector_type;
                  if (((sVar1 == 6) ||
                      ((sVar1 != 7 && ((sVar1 == 8 || (2 < victim->in_room->area->sky)))))) &&
                     (ch->in_room == victim->in_room)) goto LAB_002fa5f8;
                }
                bVar2 = is_affected(ch,(int)gsn_sense_disturbance);
                if ((((!bVar2) || (ch->in_room->sector_type == 8)) ||
                    (victim->in_room->sector_type == 8)) &&
                   (((bVar2 = is_affected(ch,(int)gsn_sensevibrations), !bVar2 ||
                     ((victim->in_room->sector_type & 0xfffeU) == 8)) ||
                    (((ch->in_room->sector_type & 0xfffeU) == 8 ||
                     ((bVar2 = is_affected_by(victim,0xf), bVar2 ||
                      (bVar2 = is_affected_by(victim,0x13), bVar2)))))))) goto LAB_002fa5c7;
              }
LAB_002fa5f8:
              bVar2 = is_affected_by(victim,0x10);
              if ((bVar2) &&
                 ((bVar2 = is_affected_by(ch,5), !bVar2 && (victim->fighting == (CHAR_DATA *)0x0))))
              {
                iVar3 = (int)gsn_darksight;
                bVar2 = is_affected(ch,iVar3);
                if ((!bVar2) ||
                   (((pAVar5 = affect_find(ch->affected,iVar3), pAVar5 == (AFFECT_DATA *)0x0 ||
                     (pAVar5->aftype != 1)) || (bVar2 = room_is_dark(victim->in_room), !bVar2)))) {
                  bVar2 = is_affected(ch,(int)gsn_hydroperception);
                  if (bVar2) {
                    sVar1 = ch->in_room->sector_type;
                    if (((sVar1 == 6) ||
                        ((sVar1 != 7 && ((sVar1 == 8 || (2 < victim->in_room->area->sky)))))) &&
                       (ch->in_room == victim->in_room)) goto LAB_002fa621;
                  }
                  bVar2 = is_affected(ch,(int)gsn_sensevibrations);
                  if (((!bVar2) || ((victim->in_room->sector_type & 0xfffeU) == 8)) ||
                     (((ch->in_room->sector_type & 0xfffeU) == 8 ||
                      ((bVar2 = is_affected_by(victim,0xf), bVar2 ||
                       (bVar2 = is_affected_by(victim,0x13), bVar2)))))) goto LAB_002fa5c7;
                }
              }
LAB_002fa621:
              bVar2 = is_affected_by(victim,0xb);
              if (((!bVar2) || (bVar2 = is_affected_by(ch,8), bVar2)) &&
                 (((bVar2 = is_npc(ch), bVar2 || (bVar2 = room_is_dark(ch->in_room), !bVar2)) ||
                  (bVar2 = is_affected_by(ch,0x19), bVar2)))) goto LAB_002fa4fc;
            }
          }
        }
      }
    }
LAB_002fa5c7:
    bVar2 = false;
  }
  else {
    if (ch != victim) goto LAB_002fa3d8;
LAB_002fa4fc:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool can_see(CHAR_DATA *ch, CHAR_DATA *victim)
{
	AREA_AFFECT_DATA *paf;
	AFFECT_DATA *af;

	if (is_npc(ch) && IS_SET(ch->act, ACT_DETECT_SPECIAL))
		return true;

	if (ch == victim)
		return true;

	if (!is_immortal(ch) && is_affected_by(victim, AFF_NOSHOW))
		return false;

	if (is_cabal_guard(ch) && !ch->desc)
		return true;

	if (get_trust(ch) < victim->invis_level)
		return false;

	if (get_trust(ch) < victim->incog_level && ch->in_room != victim->in_room)
		return false;

	if (get_trust(ch) == LEVEL_HERO && victim->invis_level == LEVEL_HERO && !is_heroimm(ch))
		return false;

	if ((!is_npc(ch) && IS_SET(ch->act, PLR_HOLYLIGHT)) || (is_npc(ch) && is_immortal(ch)))
		return true;

	if (is_npc(ch) && victim->invis_level >= LEVEL_HERO)
		return false;

	if (!is_npc(ch) && ch->pcdata->death_status == HAS_DIED)
		return true;

	/* Make sure cabal guardians can always see */
	if (is_cabal_guard(ch))
		return true;

	if (is_affected_by(ch, AFF_BLIND))
		return false;

	if (is_affected(victim, gsn_ultradiffusion))
		return false;

	if (is_affected_area(ch->in_room->area, gsn_whiteout) && is_outside(ch))
	{
		for (paf = ch->in_room->area->affected; paf; paf = paf->next)
		{
			if (paf->type == gsn_whiteout)
				break;
		}

		if (paf->owner != ch)
			return false;
	}

	if (is_affected(victim, gsn_watermeld) && !is_affected(ch, gsn_hydroperception))
		return false;

	if (is_affected(victim, gsn_earthfade))
		return false;

	if (is_affected_by(victim, AFF_INVISIBLE)
		&& !is_affected_by(ch, AFF_DETECT_INVIS)
		&& (!(is_affected(ch, gsn_hydroperception)
			&& (ch->in_room->sector_type == SECT_WATER
				|| ch->in_room->sector_type == SECT_UNDERWATER
				|| (ch->in_room->sector_type != SECT_INSIDE && victim->in_room->area->sky >= WeatherCondition::Drizzle))
			&& ch->in_room == victim->in_room))
		&& !(is_affected(ch, gsn_sense_disturbance)
			&& ch->in_room->sector_type != SECT_UNDERWATER
			&& victim->in_room->sector_type != SECT_UNDERWATER)
		&& (!(is_affected(ch, gsn_sensevibrations)
			&& victim->in_room->sector_type != SECT_UNDERWATER
			&& victim->in_room->sector_type != SECT_AIR
			&& ch->in_room->sector_type != SECT_UNDERWATER
			&& ch->in_room->sector_type != SECT_AIR
			&& !is_affected_by(victim, AFF_SNEAK)
			&& !is_affected_by(victim, AFF_FLYING))))
	{
		return false;
	}

	if (is_affected_by(victim, AFF_HIDE)
		&& !is_affected_by(ch, AFF_DETECT_HIDDEN)
		&& victim->fighting == nullptr
		&& !(is_affected(ch, gsn_darksight)
			&& (af = affect_find(ch->affected, gsn_darksight))
			&& af->aftype == AFT_SKILL
			&& room_is_dark(victim->in_room))
		&& !(is_affected(ch, gsn_hydroperception)
			&& (ch->in_room->sector_type == SECT_WATER
				|| ch->in_room->sector_type == SECT_UNDERWATER
				|| (ch->in_room->sector_type != SECT_INSIDE && victim->in_room->area->sky >= WeatherCondition::Drizzle))
			&& ch->in_room == victim->in_room)
		&& !(is_affected(ch, gsn_sensevibrations)
			&& victim->in_room->sector_type != SECT_UNDERWATER
			&& victim->in_room->sector_type != SECT_AIR
			&& ch->in_room->sector_type != SECT_UNDERWATER
			&& ch->in_room->sector_type != SECT_AIR
			&& !is_affected_by(victim, AFF_SNEAK)
			&& !is_affected_by(victim, AFF_FLYING)))
	{
		return false;
	}

	if (is_affected_by(victim, AFF_CAMOUFLAGE) && !is_affected_by(ch, AFF_DETECT_CAMO))
		return false;

	if (is_npc(ch))
		return true;

	if (room_is_dark(ch->in_room) && !is_affected_by(ch, AFF_DARK_VISION))
		return false;

	return true;
}